

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall LINSimulationDataGenerator::SwapEnds(LINSimulationDataGenerator *this,U8 *byte)

{
  int iVar1;
  byte bVar2;
  
  bVar2 = 0;
  for (iVar1 = 7; -1 < iVar1; iVar1 = iVar1 + -1) {
    bVar2 = (byte)((*byte >> ((byte)iVar1 & 0x1f)) << 7 | bVar2) >> (iVar1 != 0);
  }
  *byte = bVar2;
  return;
}

Assistant:

void LINSimulationDataGenerator::SwapEnds( U8& byte )
{
    U8 t = 0;
    for( int n = 7; n >= 0; n-- )
    {
        t |= ( ( byte >> n ) & 1 ) << 7;
        if( n )
            t >>= 1;
    }
    byte = t;
}